

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.c
# Opt level: O0

void BrotliBuildHistogramsWithContext
               (Command *cmds,size_t num_commands,BlockSplit *literal_split,
               BlockSplit *insert_and_copy_split,BlockSplit *dist_split,uint8_t *ringbuffer,
               size_t start_pos,size_t mask,uint8_t prev_byte,uint8_t prev_byte2,
               ContextType *context_modes,HistogramLiteral *literal_histograms,
               HistogramCommand *insert_and_copy_histograms,HistogramDistance *copy_dist_histograms)

{
  int iVar1;
  uint uVar2;
  Command *pCVar3;
  long lVar4;
  size_t context_1;
  ContextLut lut;
  size_t context;
  size_t j;
  Command *cmd;
  size_t i;
  BlockSplitIterator dist_it;
  BlockSplitIterator insert_and_copy_it;
  BlockSplitIterator literal_it;
  size_t pos;
  uint8_t *ringbuffer_local;
  BlockSplit *dist_split_local;
  BlockSplit *insert_and_copy_split_local;
  BlockSplit *literal_split_local;
  size_t num_commands_local;
  Command *cmds_local;
  uint32_t c;
  uint32_t r;
  uint local_1c;
  
  literal_it.length_ = start_pos;
  InitBlockSplitIterator((BlockSplitIterator *)&insert_and_copy_it.length_,literal_split);
  InitBlockSplitIterator((BlockSplitIterator *)&dist_it.length_,insert_and_copy_split);
  InitBlockSplitIterator((BlockSplitIterator *)&i,dist_split);
  for (cmd = (Command *)0x0; cmd < num_commands; cmd = (Command *)((long)&cmd->insert_len_ + 1)) {
    pCVar3 = cmds + (long)cmd;
    BlockSplitIteratorNext((BlockSplitIterator *)&dist_it.length_);
    insert_and_copy_histograms[insert_and_copy_it.idx_].data_[pCVar3->cmd_prefix_] =
         insert_and_copy_histograms[insert_and_copy_it.idx_].data_[pCVar3->cmd_prefix_] + 1;
    insert_and_copy_histograms[insert_and_copy_it.idx_].total_count_ =
         insert_and_copy_histograms[insert_and_copy_it.idx_].total_count_ + 1;
    for (context = (size_t)pCVar3->insert_len_; context != 0; context = context - 1) {
      BlockSplitIteratorNext((BlockSplitIterator *)&insert_and_copy_it.length_);
      lut = (ContextLut)literal_it.idx_;
      if (context_modes != (ContextType *)0x0) {
        lut = (ContextLut)
              (literal_it.idx_ * 0x40 +
              (long)(int)(uint)(""[(ulong)prev_byte + (ulong)(context_modes[literal_it.idx_] << 9)]
                               | ""[(ulong)prev_byte2 +
                                    (ulong)(context_modes[literal_it.idx_] << 9) + 0x100]));
      }
      literal_histograms[(long)lut].data_[ringbuffer[literal_it.length_ & mask]] =
           literal_histograms[(long)lut].data_[ringbuffer[literal_it.length_ & mask]] + 1;
      literal_histograms[(long)lut].total_count_ = literal_histograms[(long)lut].total_count_ + 1;
      prev_byte2 = prev_byte;
      prev_byte = ringbuffer[literal_it.length_ & mask];
      literal_it.length_ = literal_it.length_ + 1;
    }
    literal_it.length_ = (pCVar3->copy_len_ & 0x1ffffff) + literal_it.length_;
    if ((pCVar3->copy_len_ & 0x1ffffff) != 0) {
      prev_byte2 = ringbuffer[literal_it.length_ - 2 & mask];
      prev_byte = ringbuffer[literal_it.length_ - 1 & mask];
      if (0x7f < pCVar3->cmd_prefix_) {
        BlockSplitIteratorNext((BlockSplitIterator *)&i);
        iVar1 = (int)(uint)pCVar3->cmd_prefix_ >> 6;
        local_1c = pCVar3->cmd_prefix_ & 7;
        if (((((iVar1 != 0) && (iVar1 != 2)) && (iVar1 != 4)) && (iVar1 != 7)) || (2 < local_1c)) {
          local_1c = 3;
        }
        lVar4 = dist_it.idx_ * 4 + (ulong)local_1c;
        uVar2 = pCVar3->dist_prefix_ & 0x3ff;
        copy_dist_histograms[lVar4].data_[(int)uVar2] =
             copy_dist_histograms[lVar4].data_[(int)uVar2] + 1;
        copy_dist_histograms[lVar4].total_count_ = copy_dist_histograms[lVar4].total_count_ + 1;
      }
    }
  }
  return;
}

Assistant:

void BrotliBuildHistogramsWithContext(
    const Command* cmds, const size_t num_commands,
    const BlockSplit* literal_split, const BlockSplit* insert_and_copy_split,
    const BlockSplit* dist_split, const uint8_t* ringbuffer, size_t start_pos,
    size_t mask, uint8_t prev_byte, uint8_t prev_byte2,
    const ContextType* context_modes, HistogramLiteral* literal_histograms,
    HistogramCommand* insert_and_copy_histograms,
    HistogramDistance* copy_dist_histograms) {
  size_t pos = start_pos;
  BlockSplitIterator literal_it;
  BlockSplitIterator insert_and_copy_it;
  BlockSplitIterator dist_it;
  size_t i;

  InitBlockSplitIterator(&literal_it, literal_split);
  InitBlockSplitIterator(&insert_and_copy_it, insert_and_copy_split);
  InitBlockSplitIterator(&dist_it, dist_split);
  for (i = 0; i < num_commands; ++i) {
    const Command* cmd = &cmds[i];
    size_t j;
    BlockSplitIteratorNext(&insert_and_copy_it);
    HistogramAddCommand(&insert_and_copy_histograms[insert_and_copy_it.type_],
        cmd->cmd_prefix_);
    /* TODO: unwrap iterator blocks. */
    for (j = cmd->insert_len_; j != 0; --j) {
      size_t context;
      BlockSplitIteratorNext(&literal_it);
      context = literal_it.type_;
      if (context_modes) {
        ContextLut lut = BROTLI_CONTEXT_LUT(context_modes[context]);
        context = (context << BROTLI_LITERAL_CONTEXT_BITS) +
            BROTLI_CONTEXT(prev_byte, prev_byte2, lut);
      }
      HistogramAddLiteral(&literal_histograms[context],
          ringbuffer[pos & mask]);
      prev_byte2 = prev_byte;
      prev_byte = ringbuffer[pos & mask];
      ++pos;
    }
    pos += CommandCopyLen(cmd);
    if (CommandCopyLen(cmd)) {
      prev_byte2 = ringbuffer[(pos - 2) & mask];
      prev_byte = ringbuffer[(pos - 1) & mask];
      if (cmd->cmd_prefix_ >= 128) {
        size_t context;
        BlockSplitIteratorNext(&dist_it);
        context = (dist_it.type_ << BROTLI_DISTANCE_CONTEXT_BITS) +
            CommandDistanceContext(cmd);
        HistogramAddDistance(&copy_dist_histograms[context],
            cmd->dist_prefix_ & 0x3FF);
      }
    }
  }
}